

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O3

void __thiscall soplex::CLUFactorRational::colSingletons(CLUFactorRational *this)

{
  int iVar1;
  int p_col;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  pointer pnVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  int *piVar14;
  int *piVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int *piVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  
  iVar16 = (this->temp).stage;
  if (0 < iVar16) {
    piVar3 = (this->row).orig;
    piVar4 = (this->row).perm;
    piVar5 = (this->temp).s_mark;
    lVar19 = 0;
    piVar14 = (this->u).row.idx;
    do {
      iVar1 = piVar3[lVar19];
      lVar25 = (long)(this->u).row.len[iVar1];
      piVar15 = piVar14;
      if (0 < lVar25) {
        iVar16 = (this->u).row.start[iVar1];
        lVar24 = 0;
        do {
          p_col = piVar14[iVar16 + lVar24];
          piVar6 = (this->u).col.idx;
          piVar7 = (this->u).col.start;
          piVar8 = (this->u).col.len;
          piVar9 = (this->temp).s_cact;
          iVar20 = (piVar8[p_col] + piVar7[p_col]) - piVar9[p_col];
          piVar12 = piVar6 + iVar20;
          do {
            piVar21 = piVar12;
            piVar12 = piVar21 + 1;
          } while (*piVar21 != iVar1);
          *piVar21 = piVar6[iVar20];
          piVar6[iVar20] = iVar1;
          iVar20 = piVar9[p_col];
          piVar9[p_col] = iVar20 + -1;
          if (iVar20 == 2) {
            iVar20 = piVar8[p_col];
            piVar8[p_col] = iVar20 + -1;
            iVar20 = piVar6[(long)piVar7[p_col] + (long)iVar20 + -1];
            if (-1 < piVar4[iVar20]) goto LAB_001874e6;
            piVar6 = (this->u).row.len;
            iVar18 = piVar6[iVar20] + -1;
            iVar2 = (this->u).row.start[iVar20];
            piVar6[iVar20] = iVar18;
            lVar17 = (long)(iVar2 + iVar18);
            lVar22 = lVar17 * 4 + 4;
            lVar13 = lVar17 * 0x40 + 0x40;
            do {
              lVar26 = lVar13;
              lVar23 = lVar22 + -4;
              lVar11 = lVar22 + -4;
              lVar22 = lVar23;
              lVar13 = lVar26 + -0x40;
            } while (*(int *)((long)piVar15 + lVar11) != p_col);
            setPivot(this,(this->temp).stage,p_col,iVar20,
                     (Rational *)
                     ((long)&(this->u).row.val.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value +
                     lVar26));
            iVar20 = (this->temp).stage;
            (this->temp).stage = iVar20 + 1;
            piVar5[iVar20] = p_col;
            pnVar10 = (this->u).row.val.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)((long)&pnVar10[-1].m_backend.m_value + lVar26),
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)(pnVar10 + lVar17));
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)((long)&pnVar10[-1].m_backend.m_value + lVar26 + 0x20),
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)((long)&pnVar10[lVar17].m_backend.m_value + 0x20));
            piVar15 = (this->u).row.idx;
            *(int *)((long)piVar15 + lVar23) = piVar15[lVar17];
          }
          else if (iVar20 == 1) {
LAB_001874e6:
            this->stat = SINGULAR;
            return;
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 != lVar25);
        iVar16 = (this->temp).stage;
      }
      lVar19 = lVar19 + 1;
      piVar14 = piVar15;
    } while (lVar19 < iVar16);
  }
  return;
}

Assistant:

inline void CLUFactorRational::colSingletons()
{
   int i, j, k, n;
   int len;
   int p_col, p_row, newrow;
   int* idx;
   int* rorig = row.orig;
   int* rperm = row.perm;
   int* sing = temp.s_mark;


   /*  Iteratively update column counts due to removed column singletons
    *  thereby removing new arising columns singletons
    *  and computing the index of the first row singleton (-1)
    *  until no more can be found.
    */

   for(i = 0; i < temp.stage; ++i)
   {
      p_row = rorig[i];
      assert(p_row >= 0);
      idx = &(u.row.idx[u.row.start[p_row]]);
      len = u.row.len[p_row];

      for(j = 0; j < len; ++j)
      {
         /*  Move pivotal nonzeros to front of column.
          */
         p_col = idx[j];
         assert(temp.s_cact[p_col] > 0);

         n = u.col.start[p_col] + u.col.len[p_col] - temp.s_cact[p_col];

         for(k = n; u.col.idx[k] != p_row; ++k)
            ;

         assert(k < u.col.start[p_col] + u.col.len[p_col]);

         u.col.idx[k] = u.col.idx[n];

         u.col.idx[n] = p_row;

         n = --(temp.s_cact[p_col]);          /* column nonzeros of ACTIVE matrix */

         if(n == 1)                   /* Here is another singleton */
         {
            newrow = u.col.idx[--u.col.len[p_col] + u.col.start[p_col]];

            /*      Ensure, matrix not singular
             */

            if(rperm[newrow] >= 0)
            {
               stat = SLinSolverRational::SINGULAR;
               return;
            }

            /*      Find singleton in row.
             */
            n = u.row.start[newrow] + (--(u.row.len[newrow]));

            for(k = n; u.row.idx[k] != p_col; --k)
               ;

            /*      Remove singleton from column.
             */
            setPivot(temp.stage, p_col, newrow, u.row.val[k]);

            sing[temp.stage++] = p_col;

            /*      Move pivot element to diag.
             */
            u.row.val[k] = u.row.val[n];

            u.row.idx[k] = u.row.idx[n];
         }
         else if(n == 0)
         {
            stat = SLinSolverRational::SINGULAR;
            return;
         }
      }
   }

   assert(temp.stage <= thedim);
}